

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile(cmFindPackageCommandHoldFile *this)

{
  allocator<char> local_21;
  string local_20;
  
  if (this->File != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_20,this->File,&local_21);
    cmsys::SystemTools::RemoveFile(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_20._M_dataplus._M_p != &local_20.field_2) {
      operator_delete(local_20._M_dataplus._M_p,local_20.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

~cmFindPackageCommandHoldFile()
  {
    if (this->File) {
      cmSystemTools::RemoveFile(this->File);
    }
  }